

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultExtendsClauseArgSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultExtendsClauseArgSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  DefaultExtendsClauseArgSyntax *pDVar16;
  
  pDVar16 = (DefaultExtendsClauseArgSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((DefaultExtendsClauseArgSyntax *)this->endPtr < pDVar16 + 1) {
    pDVar16 = (DefaultExtendsClauseArgSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pDVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_2->kind;
  uVar13 = args_2->field_0x2;
  NVar14.raw = (args_2->numFlags).raw;
  uVar15 = args_2->rawLen;
  pIVar3 = args_2->info;
  (pDVar16->super_SyntaxNode).kind = DefaultExtendsClauseArg;
  (pDVar16->super_SyntaxNode).parent = (SyntaxNode *)0x0;
  (pDVar16->super_SyntaxNode).previewNode = (SyntaxNode *)0x0;
  (pDVar16->openParen).kind = TVar4;
  (pDVar16->openParen).field_0x2 = uVar5;
  (pDVar16->openParen).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar16->openParen).rawLen = uVar7;
  (pDVar16->openParen).info = pIVar1;
  (pDVar16->defaultKeyword).kind = TVar8;
  (pDVar16->defaultKeyword).field_0x2 = uVar9;
  (pDVar16->defaultKeyword).numFlags = (NumericTokenFlags)NVar10.raw;
  (pDVar16->defaultKeyword).rawLen = uVar11;
  (pDVar16->defaultKeyword).info = pIVar2;
  (pDVar16->closeParen).kind = TVar12;
  (pDVar16->closeParen).field_0x2 = uVar13;
  (pDVar16->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pDVar16->closeParen).rawLen = uVar15;
  (pDVar16->closeParen).info = pIVar3;
  return pDVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }